

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O3

ListenerImpl * __thiscall
PoolList<Server::Private::ListenerImpl>::allocateFreeItem
          (PoolList<Server::Private::ListenerImpl> *this)

{
  ulong uVar1;
  ItemBlock *pIVar2;
  Item *pIVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  pIVar3 = this->freeItem;
  if (pIVar3 == (Item *)0x0) {
    pIVar2 = (ItemBlock *)operator_new__(0x88);
    pIVar2->next = this->blocks;
    this->blocks = pIVar2;
    lVar5 = 8;
    lVar6 = 0;
    uVar1 = 0xffffffffffffffe8;
    do {
      uVar4 = uVar1;
      *(long *)((long)&pIVar2[4].next + uVar4) = lVar6;
      lVar6 = (long)&pIVar2->next + lVar5;
      lVar5 = lVar5 + 0x20;
      uVar1 = uVar4 + 0x20;
    } while (uVar4 + 0x20 < 0x68);
    pIVar3 = (Item *)((long)&pIVar2[4].next + uVar4);
    this->freeItem = pIVar3;
  }
  return (ListenerImpl *)(pIVar3 + 1);
}

Assistant:

T* allocateFreeItem()
  {
    Item* item = freeItem;
    if(!item)
    {
      ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + (sizeof(Item) + sizeof(T)) * 4];
      itemBlock->next = blocks;
      blocks = itemBlock;
      for(Item* i = (Item*)(itemBlock + 1), * end = (Item*)((char*)i + 4 * (sizeof(Item) + sizeof(T)));
        i < end; 
        i = (Item*)((char*)i + (sizeof(Item) + sizeof(T))))
      {
        i->prev = item;
        item = i;
      }
      freeItem = item;
    }
    return (T*)(item + 1);
  }